

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  sexp_conflict psVar2;
  
  iVar1 = strcmp(version,"0.11.0");
  psVar2 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      sexp_define_foreign_aux
                (ctx,env,"%make-parameter",2,0,"sexp_make_parameter",sexp_make_parameter,0);
      sexp_define_foreign_aux
                (ctx,env,"parameter-converter",1,0,"sexp_parameter_converter",
                 sexp_parameter_converter,0);
      psVar2 = (sexp_conflict)0x43e;
    }
  }
  return psVar2;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;

  sexp_define_foreign(ctx, env, "%make-parameter", 2, sexp_make_parameter);
  sexp_define_foreign(ctx, env, "parameter-converter", 1, sexp_parameter_converter);

  return SEXP_VOID;
}